

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::LegacyReporterAdapter::testCaseEnded
          (LegacyReporterAdapter *this,TestCaseStats *testCaseStats)

{
  IReporter *pIVar1;
  
  if (testCaseStats->missingAssertions == true) {
    pIVar1 = (this->m_legacyReporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])
              (pIVar1,&testCaseStats->testInfo);
  }
  pIVar1 = (this->m_legacyReporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[10])
            (pIVar1,&testCaseStats->testInfo,&testCaseStats->totals,&testCaseStats->stdOut,
             &testCaseStats->stdErr);
  return;
}

Assistant:

void LegacyReporterAdapter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        if( testCaseStats.missingAssertions )
            m_legacyReporter->NoAssertionsInTestCase( testCaseStats.testInfo.name );
        m_legacyReporter->EndTestCase
            (   testCaseStats.testInfo,
                testCaseStats.totals,
                testCaseStats.stdOut,
                testCaseStats.stdErr );
    }